

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * extraZddGetSingletons(DdManager *dd,DdNode *bVars)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *Q;
  DdNode *data;
  
  pDVar2 = dd->one;
  if ((pDVar2 != bVars) &&
     (pDVar2 = cuddCacheLookup1Zdd(dd,extraZddGetSingletons,bVars), pDVar2 == (DdNode *)0x0)) {
    pDVar2 = extraZddGetSingletons(dd,(bVars->type).kids.T);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Q = cuddZddGetNode(dd,bVars->index * 2,dd->one,dd->zero);
      if (Q != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = cuddZddUnion(dd,pDVar2,Q);
        if (data != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,Q);
          piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert1(dd,extraZddGetSingletons,bVars,data);
          return data;
        }
        Cudd_RecursiveDerefZdd(dd,pDVar2);
        pDVar2 = Q;
      }
      Cudd_RecursiveDerefZdd(dd,pDVar2);
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode * extraZddGetSingletons( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars)    /* the set of variables */
{
    DdNode * zRes;

    if ( bVars == b1 )
//    if ( bVars == b0 )  // bug fixed by Jin Zhang, Jan 23, 2004
        return z1;

    if ( (zRes = cuddCacheLookup1Zdd(dd, extraZddGetSingletons, bVars)) )
        return zRes;
    else
    {
        DdNode * zTemp, * zPlus;          

        // solve subproblem
        zRes = extraZddGetSingletons( dd, cuddT(bVars) );
        if ( zRes == NULL ) 
            return NULL;
        cuddRef( zRes );
        
        zPlus = cuddZddGetNode( dd, 2*bVars->index, z1, z0 );
        if ( zPlus == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zPlus );

        // add these to the result
        zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
        if ( zRes == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
            return NULL;
        }
        cuddRef( zRes );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zPlus );
        cuddDeref( zRes );

        cuddCacheInsert1( dd, extraZddGetSingletons, bVars, zRes );
        return zRes;
    }
}